

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureViewTestCoherency::checkProgramWriteCoherency
          (TextureViewTestCoherency *this,_texture_type texture_type,bool should_use_images,
          _barrier_type barrier_type,_verification_mean verification_mean)

{
  ostringstream *this_00;
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  long lVar7;
  long lVar8;
  MessageBuilder *this_01;
  TestError *this_02;
  undefined7 in_register_00000011;
  bool bVar9;
  byte bVar10;
  bool bVar11;
  int iVar12;
  ulong uVar13;
  char *msg;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  uint write_to_height;
  uint write_to_width;
  uint read_lod;
  GLuint write_to_id;
  GLuint read_to_id;
  uint local_1e8;
  uint local_1e4;
  void *local_1e0;
  uint local_1d4;
  GLuint local_1d0;
  int local_1cc;
  TextureViewTestCoherency *local_1c8;
  GLuint local_1bc;
  char *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  local_1d0 = 0;
  local_1e4 = 0;
  local_1e8 = 0;
  getWritePropertiesForTextureType(this,texture_type,&local_1d0,&local_1e4,&local_1e8);
  iVar4 = (int)CONCAT71(in_register_00000011,should_use_images);
  local_1e0 = (void *)CONCAT44(local_1e0._4_4_,verification_mean);
  if (iVar4 == 0) {
    (**(code **)(lVar6 + 0x78))(0x8d40,this->m_draw_fbo_id);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glBindFramebuffer() call failed for GL_FRAMEBUFFER target",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x203d);
    (**(code **)(lVar6 + 0x6a0))(0x8ca9,0x8ce0,0xde1,local_1d0,1);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glFramebufferTexture2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2040);
    (**(code **)(lVar6 + 0x1a00))(0,0,local_1e4,local_1e8);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    msg = "glViewport() call failed.";
    iVar12 = 0x2046;
  }
  else {
    (**(code **)(lVar6 + 0x80))(0,local_1d0,1,0,0,0x88b9,0x8058);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    msg = "glBindImageTexture() call failed.";
    iVar12 = 0x2036;
  }
  glu::checkError(dVar5,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,iVar12);
  local_1cc = iVar4;
  if (should_use_images) {
    (**(code **)(lVar6 + 0x1680))(this->m_gradient_image_write_po_id);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x204e);
    uVar15 = local_1e4;
    uVar3 = local_1e8;
    local_1c8 = this;
    (**(code **)(lVar6 + 0x1530))
              (this->m_gradient_image_write_image_size_location,local_1e4,local_1e8);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glUniform2i() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2051);
    (**(code **)(lVar6 + 0x5e0))(0x8c89);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glEnable(GL_RASTERIZER_DISCARD) call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2054);
    (**(code **)(lVar6 + 0x538))(0,0,uVar3 * uVar15);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2057);
    (**(code **)(lVar6 + 0x4e8))(0x8c89);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glDisable(GL_RASTERIZER_DISCARD) call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x205a);
    if (barrier_type == BARRIER_TYPE_TEXTURE_UPDATE_BUFFER_BIT) {
      (**(code **)(lVar6 + 0xdb8))(0x100);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,
                      "glMemoryBarrier() call failed for GL_TEXTURE_UPDATE_BARRIER_BIT barrier",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x206e);
      this = local_1c8;
    }
    else {
      if (barrier_type != BARRIER_TYPE_TEXTURE_FETCH_BARRIER_BIT) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"Unrecognized barrier type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                   ,0x2075);
        goto LAB_00a4627f;
      }
      (**(code **)(lVar6 + 0xdb8))(8);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glMemoryBarrier() call failed for GL_TEXTURE_FETCH_BARRIER_BIT barrier"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x2064);
      this = local_1c8;
    }
  }
  else {
    (**(code **)(lVar6 + 0x1680))(this->m_gradient_write_po_id);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"gluseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x207d);
    (**(code **)(lVar6 + 0x538))(5,0,4);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2080);
  }
  local_1d4 = 0;
  local_1bc = 0;
  getReadPropertiesForTextureType(this,texture_type,&local_1bc,&local_1d4);
  (**(code **)(lVar6 + 8))(0x84c0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glActiveTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x208f);
  (**(code **)(lVar6 + 0xb8))(0xde1,local_1bc);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2092);
  uVar3 = local_1e4;
  uVar18 = (ulong)local_1e4;
  uVar13 = (ulong)local_1e8;
  iVar4 = local_1e8 * local_1e4;
  if ((int)local_1e0 == 0) {
    (**(code **)(lVar6 + 0x1680))(this->m_gradient_verification_po_id);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x209b);
    (**(code **)(lVar6 + 0x14f0))(this->m_gradient_verification_po_texture_location,0);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glUniform1i() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x209e);
    (**(code **)(lVar6 + 0x14f0))
              (this->m_gradient_verification_po_sample_exact_uv_location,(undefined1)local_1cc);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glUniform1i() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20a1);
    (**(code **)(lVar6 + 0x14e0))((float)local_1d4,this->m_gradient_verification_po_lod_location);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glUniform1f() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20a4);
    (**(code **)(lVar6 + 0x5e0))(0x8c89);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glEnable(GL_RASTERIZER_DISCARD) call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20a7);
    (**(code **)(lVar6 + 0x30))(0);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glBeginTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20aa);
    (**(code **)(lVar6 + 0x538))(0,0,iVar4);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20ad);
    (**(code **)(lVar6 + 0x638))();
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glEndTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20b0);
    (**(code **)(lVar6 + 0x4e8))(0x8c89);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glDisable(GL_RASTERIZER_DISCARD) call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20b3);
    lVar7 = (**(code **)(lVar6 + 0xcf8))(0x8c8e,35000);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glMapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20b8);
    if (lVar7 != 0) {
      if (iVar4 != 0) {
        lVar8 = 0;
        do {
          if (*(int *)(lVar7 + lVar8 * 4) != 1) {
            local_1b0._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            this_00 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"Invalid data was sampled at ",0x1c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,") when sampling from ",0x15);
            local_1b8 = "a view";
            if (texture_type == TEXTURE_TYPE_PARENT_TEXTURE) {
              local_1b8 = "a texture";
            }
            this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&local_1b8);
            tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            (**(code **)(lVar6 + 0x1670))(0x8c8e);
            this_02 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_02,"Invalid data sampled",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                       ,0x20cf);
            goto LAB_00a4627f;
          }
          lVar8 = lVar8 + 1;
        } while (iVar4 != (int)lVar8);
      }
      (**(code **)(lVar6 + 0x1670))(0x8c8e);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glUnmapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x20d5);
      return;
    }
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"glMapBuffer() did not generate an error but returned a NULL pointer",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x20bc);
  }
  else {
    local_1e0 = operator_new__((ulong)(iVar4 * this->m_texture_n_components));
    (**(code **)(lVar6 + 0xaa0))(0xde1,local_1d4,0x1908,0x1401,local_1e0);
    iVar4 = (**(code **)(lVar6 + 0x800))();
    if (iVar4 == 0) {
      if (uVar13 == 0) {
        operator_delete__(local_1e0);
        return;
      }
      bVar11 = true;
      uVar14 = 0;
      do {
        if (uVar18 != 0) {
          uVar15 = uVar3 * this->m_texture_n_components * (int)uVar14;
          uVar16 = 0;
          uVar17 = 0;
          bVar9 = bVar11;
          do {
            fVar21 = (float)(uVar17 & 0xffffffff) / (float)uVar18;
            fVar22 = 1.0 - fVar21;
            uVar20 = (uint)*(byte *)((long)local_1e0 + uVar16 + uVar15) -
                     ((int)((fVar21 * 0.0 + fVar22) * 255.0) & 0xffU);
            uVar19 = -uVar20;
            if (0 < (int)uVar20) {
              uVar19 = uVar20;
            }
            bVar1 = false;
            bVar11 = false;
            if ((uVar19 & 0xff) < 2) {
              uVar20 = (uint)*(byte *)((long)local_1e0 + uVar16 + (ulong)uVar15 + 1) -
                       ((int)((fVar22 * 0.9 + fVar21 * 0.1) * 255.0) & 0xffU);
              uVar19 = -uVar20;
              if (0 < (int)uVar20) {
                uVar19 = uVar20;
              }
              bVar1 = false;
              bVar11 = false;
              if ((uVar19 & 0xff) < 2) {
                uVar19 = (int)((fVar22 * 0.0 + fVar21) * 255.0) & 0xff;
                iVar4 = *(byte *)((long)local_1e0 + uVar16 + (ulong)uVar15 + 2) - uVar19;
                bVar2 = (byte)iVar4;
                bVar10 = -bVar2;
                if (0 < iVar4) {
                  bVar10 = bVar2;
                }
                bVar1 = false;
                bVar11 = false;
                if (bVar10 < 2) {
                  iVar12 = *(byte *)((long)local_1e0 + uVar16 + (ulong)uVar15 + 3) - uVar19;
                  iVar4 = -iVar12;
                  if (0 < iVar12) {
                    iVar4 = iVar12;
                  }
                  bVar1 = iVar4 < 2;
                  bVar11 = bVar9;
                  if (1 < iVar4) {
                    bVar11 = false;
                  }
                }
              }
            }
            if (!bVar1) break;
            uVar17 = uVar17 + 1;
            uVar16 = (ulong)((int)uVar16 + this->m_texture_n_components);
            bVar9 = bVar11;
          } while (uVar17 < uVar18);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar13);
      operator_delete__(local_1e0);
      if (bVar11) {
        return;
      }
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_02,"Invalid data sampled",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x2115);
    }
    else {
      operator_delete__(local_1e0);
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_02,"glGetTexImage() call failed.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x20e6);
    }
  }
LAB_00a4627f:
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureViewTestCoherency::checkProgramWriteCoherency(_texture_type texture_type, bool should_use_images,
														  _barrier_type		 barrier_type,
														  _verification_mean verification_mean)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (!should_use_images)
	{
		/* Sanity check: no barrier should be requested if images are not used */
		DE_ASSERT(barrier_type == BARRIER_TYPE_NONE);

		/* Sanity check: glGetTexImage*() call should only be used for verification
		 *               when images are used */
		DE_ASSERT(verification_mean == VERIFICATION_MEAN_PROGRAM);
	}

	/* Determine GL id of an object we will be rendering the gradient to */
	glw::GLuint  write_to_id	 = 0;
	unsigned int write_to_width  = 0;
	unsigned int write_to_height = 0;

	getWritePropertiesForTextureType(texture_type, &write_to_id, &write_to_width, &write_to_height);

	/* Configure the render targets */
	if (should_use_images)
	{
		gl.bindImageTexture(0,				/* unit */
							write_to_id, 1, /* second level */
							GL_FALSE,		/* layered */
							0,				/* layer */
							GL_WRITE_ONLY, GL_RGBA8);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture() call failed.");
	}
	else
	{
		/* We first need to fill either the texture or its sibling view with
		 * gradient data. Set up draw framebuffer */
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_draw_fbo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed for GL_FRAMEBUFFER target");

		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, write_to_id, 1); /* level */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

		/* Configure the viewport accordingly */
		gl.viewport(0, /* x */
					0, /* y */
					write_to_width, write_to_height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed.");
	}

	/* The gradient needs to be rendered differently, depending on whether
	 * we're asked to use images or not */
	if (should_use_images)
	{
		gl.useProgram(m_gradient_image_write_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

		gl.uniform2i(m_gradient_image_write_image_size_location, write_to_width, write_to_height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform2i() call failed.");

		gl.enable(GL_RASTERIZER_DISCARD);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) call failed.");
		{
			gl.drawArrays(GL_POINTS, 0 /* first */, write_to_width * write_to_height);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
		}
		gl.disable(GL_RASTERIZER_DISCARD);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable(GL_RASTERIZER_DISCARD) call failed.");

		/* If the caller requested any barriers, issue them at this point */
		switch (barrier_type)
		{
		case BARRIER_TYPE_TEXTURE_FETCH_BARRIER_BIT:
		{
			gl.memoryBarrier(GL_TEXTURE_FETCH_BARRIER_BIT);

			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glMemoryBarrier() call failed for GL_TEXTURE_FETCH_BARRIER_BIT barrier");

			break;
		}

		case BARRIER_TYPE_TEXTURE_UPDATE_BUFFER_BIT:
		{
			gl.memoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);

			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glMemoryBarrier() call failed for GL_TEXTURE_UPDATE_BARRIER_BIT barrier");

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized barrier type");
		}
		} /* switch (barrier_type) */
	}	 /* if (should_use_images) */
	else
	{
		/* Render the gradient on a full-screen quad */
		gl.useProgram(m_gradient_write_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gluseProgram() call failed.");

		gl.drawArrays(GL_TRIANGLE_STRIP, 0 /* first */, 4 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
	}

	/* Determine which texture and which mip-map level we will need to sample
	 * in order to verify whether the former operations have been completed
	 * successfully.
	 **/
	unsigned int read_lod   = 0;
	glw::GLuint  read_to_id = 0;

	getReadPropertiesForTextureType(texture_type, &read_to_id, &read_lod);

	/* Before we proceed with verification, update the texture binding so that
	 * the verification program can sample from the right texture */
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture() call failed.");

	gl.bindTexture(GL_TEXTURE_2D, read_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	if (verification_mean == VERIFICATION_MEAN_PROGRAM)
	{
		/* Switch to a verification program. It uses a vertex shader to sample
		 * all texels of the texture so issue as many invocations as necessary. */
		unsigned int n_invocations = write_to_width * write_to_height;

		gl.useProgram(m_gradient_verification_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

		gl.uniform1i(m_gradient_verification_po_texture_location, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");

		gl.uniform1i(m_gradient_verification_po_sample_exact_uv_location, should_use_images);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");

		gl.uniform1f(m_gradient_verification_po_lod_location, (float)read_lod);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f() call failed.");

		gl.enable(GL_RASTERIZER_DISCARD);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) call failed.");

		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");
		{
			gl.drawArrays(GL_POINTS, 0 /* first */, n_invocations);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
		}
		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

		gl.disable(GL_RASTERIZER_DISCARD);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable(GL_RASTERIZER_DISCARD) call failed.");

		/* Map the result buffer object storage into process space */
		const int* result_data_ptr = (const int*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");

		if (result_data_ptr == DE_NULL)
		{
			TCU_FAIL("glMapBuffer() did not generate an error but returned a NULL pointer");
		}

		/* Verify the XFBed data */
		for (unsigned int n_invocation = 0; n_invocation < n_invocations; ++n_invocation)
		{
			if (result_data_ptr[n_invocation] != 1)
			{
				unsigned int invocation_x = n_invocation % write_to_width;
				unsigned int invocation_y = n_invocation / write_to_width;

				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data was sampled at "
								   << "(" << invocation_x << ", " << invocation_y << ") when sampling from "
								   << ((texture_type == TEXTURE_TYPE_PARENT_TEXTURE) ? "a texture" : "a view")
								   << tcu::TestLog::EndMessage;

				/* Make sure the buffer is unmapped before throwing the exception */
				gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

				TCU_FAIL("Invalid data sampled");
			}
		} /* for (all invocations) */

		/* Unmap the buffer storage */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");
	} /* if (verification_mean == VERIFICATION_MEAN_PROGRAM) */
	else
	{
		DE_ASSERT(verification_mean == VERIFICATION_MEAN_GLGETTEXIMAGE);

		/* Allocate space for the data */
		unsigned char* data_ptr = new unsigned char[write_to_width * write_to_height * m_texture_n_components];

		/* Retrieve the rendered data */
		gl.getTexImage(GL_TEXTURE_2D, read_lod, GL_RGBA, GL_UNSIGNED_BYTE, data_ptr);

		if (gl.getError() != GL_NO_ERROR)
		{
			/* Release the buffer before we throw an exception */
			delete[] data_ptr;

			TCU_FAIL("glGetTexImage() call failed.");
		}

		/* Verify the data is correct */
		const int epsilon		  = 1;
		bool	  is_data_correct = true;

		for (unsigned int y = 0; y < write_to_height; ++y)
		{
			const unsigned char* row_ptr = data_ptr + y * m_texture_n_components * write_to_width;

			for (unsigned int x = 0; x < write_to_width; ++x)
			{
				const unsigned char* texel_ptr	= row_ptr + x * m_texture_n_components;
				const float			 end_rgba[]   = { 0.0f, 0.1f, 1.0f, 1.0f };
				const float			 lerp_factor  = float(x) / float(write_to_width);
				const float			 start_rgba[] = { 1.0f, 0.9f, 0.0f, 0.0f };
				const float expected_data_float[] = { start_rgba[0] * (1.0f - lerp_factor) + end_rgba[0] * lerp_factor,
													  start_rgba[1] * (1.0f - lerp_factor) + end_rgba[1] * lerp_factor,
													  start_rgba[2] * (1.0f - lerp_factor) + end_rgba[2] * lerp_factor,
													  start_rgba[3] * (1.0f - lerp_factor) +
														  end_rgba[3] * lerp_factor };
				const unsigned char expected_data_ubyte[] = { (unsigned char)(expected_data_float[0] * 255.0f),
															  (unsigned char)(expected_data_float[1] * 255.0f),
															  (unsigned char)(expected_data_float[2] * 255.0f),
															  (unsigned char)(expected_data_float[3] * 255.0f) };

				if (de::abs((int)texel_ptr[0] - (int)expected_data_ubyte[0]) > epsilon ||
					de::abs((int)texel_ptr[1] - (int)expected_data_ubyte[1]) > epsilon ||
					de::abs((int)texel_ptr[2] - (int)expected_data_ubyte[2]) > epsilon ||
					de::abs((int)texel_ptr[3] - (int)expected_data_ubyte[3]) > epsilon)
				{
					is_data_correct = false;

					break;
				}
			}
		} /* for (all rows) */

		/* Good to release the data buffer at this point */
		delete[] data_ptr;

		data_ptr = DE_NULL;

		/* Fail the test if any of the rendered texels were found invalid */
		if (!is_data_correct)
		{
			TCU_FAIL("Invalid data sampled");
		}
	}
}